

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC16.cpp
# Opt level: O2

void __thiscall CRC16::CRC16(CRC16 *this,void *buf,size_t len,uint16_t init_)

{
  this->m_crc = 0xffff;
  std::call_once<void(&)()>(&flag,init_crc_table);
  this->m_crc = init_;
  add(this,buf,len);
  return;
}

Assistant:

CRC16::CRC16(const void* buf, size_t len, uint16_t init_)
{
    std::call_once(flag, init_crc_table);
    init(init_);
    add(buf, len);
}